

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_matrix.c
# Opt level: O0

void SUNMatDestroy(SUNMatrix A)

{
  long *in_RDI;
  
  if (in_RDI != (long *)0x0) {
    if ((in_RDI[1] == 0) || (*(long *)(in_RDI[1] + 0x10) == 0)) {
      if (*in_RDI != 0) {
        free((void *)*in_RDI);
        *in_RDI = 0;
      }
      if (in_RDI[1] != 0) {
        free((void *)in_RDI[1]);
        in_RDI[1] = 0;
      }
      free(in_RDI);
    }
    else {
      (**(code **)(in_RDI[1] + 0x10))(in_RDI);
    }
  }
  return;
}

Assistant:

void SUNMatDestroy(SUNMatrix A)
{
  if (A == NULL) { return; }

  /* if the destroy operation exists use it */
  if (A->ops)
  {
    if (A->ops->destroy)
    {
      A->ops->destroy(A);
      return;
    }
  }

  /* if we reach this point, either ops == NULL or destroy == NULL,
     try to cleanup by freeing the content, ops, and matrix */
  if (A->content)
  {
    free(A->content);
    A->content = NULL;
  }
  if (A->ops)
  {
    free(A->ops);
    A->ops = NULL;
  }
  free(A);
  A = NULL;

  return;
}